

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall
wallet::LegacyScriptPubKeyMan::TopUpChain
          (LegacyScriptPubKeyMan *this,WalletBatch *batch,CHDChain *chain,uint kpSize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  WalletStorage *pWVar3;
  unsigned_long parameters_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  int iVar4;
  long lVar5;
  CKeyID *pCVar6;
  long parameters_2;
  ulong uVar7;
  byte bVar8;
  bool internal;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Span<const_unsigned_char> s;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock42;
  CPubKey pubkey;
  undefined7 in_stack_ffffffffffffff28;
  byte bVar15;
  long parameters_1;
  long parameters_00;
  unique_lock<std::recursive_mutex> local_b0;
  string local_a0;
  CPubKey local_79;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0._M_device =
       &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.super_recursive_mutex
  ;
  local_b0._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_b0);
  iVar4 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[10])
                    ();
  bVar8 = (byte)iVar4;
  if (bVar8 != 0) goto LAB_00c061fa;
  if (kpSize == 0) {
    kpSize = (uint)this->m_keypool_size;
  }
  uVar7 = (ulong)(kpSize + (kpSize == 0));
  auVar9[0] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.super_base_blob<160U>.
                m_data._M_elems[0] ==
               (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[0]);
  auVar9[1] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.super_base_blob<160U>.
                m_data._M_elems[1] ==
               (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[1]);
  auVar9[2] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.super_base_blob<160U>.
                m_data._M_elems[2] ==
               (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[2]);
  auVar9[3] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.super_base_blob<160U>.
                m_data._M_elems[3] ==
               (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[3]);
  auVar9[4] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.super_base_blob<160U>.
                m_data._M_elems[4] ==
               (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[4]);
  auVar9[5] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.super_base_blob<160U>.
                m_data._M_elems[5] ==
               (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[5]);
  auVar9[6] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.super_base_blob<160U>.
                m_data._M_elems[6] ==
               (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[6]);
  auVar9[7] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.super_base_blob<160U>.
                m_data._M_elems[7] ==
               (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[7]);
  auVar9[8] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.super_base_blob<160U>.
                m_data._M_elems[8] ==
               (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[8]);
  auVar9[9] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.super_base_blob<160U>.
                m_data._M_elems[9] ==
               (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[9]);
  auVar9[10] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.super_base_blob<160U>
                 .m_data._M_elems[10] ==
                (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[10]);
  auVar9[0xb] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                  super_base_blob<160U>.m_data._M_elems[0xb] ==
                 (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[0xb]);
  auVar9[0xc] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                  super_base_blob<160U>.m_data._M_elems[0xc] ==
                 (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[0xc]);
  auVar9[0xd] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                  super_base_blob<160U>.m_data._M_elems[0xd] ==
                 (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[0xd]);
  auVar9[0xe] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                  super_base_blob<160U>.m_data._M_elems[0xe] ==
                 (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[0xe]);
  auVar9[0xf] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                  super_base_blob<160U>.m_data._M_elems[0xf] ==
                 (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[0xf]);
  uVar1 = *(undefined4 *)
           ((chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 0x10);
  uVar2 = *(undefined4 *)
           ((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.super_base_blob<160U>.
            m_data._M_elems + 0x10);
  auVar12[0] = -((char)uVar2 == (char)uVar1);
  auVar12[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)uVar1 >> 8));
  auVar12[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)uVar1 >> 0x10));
  auVar12[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)uVar1 >> 0x18));
  auVar12[4] = 0xff;
  auVar12[5] = 0xff;
  auVar12[6] = 0xff;
  auVar12[7] = 0xff;
  auVar12[8] = 0xff;
  auVar12[9] = 0xff;
  auVar12[10] = 0xff;
  auVar12[0xb] = 0xff;
  auVar12[0xc] = 0xff;
  auVar12[0xd] = 0xff;
  auVar12[0xe] = 0xff;
  auVar12[0xf] = 0xff;
  auVar12 = auVar12 & auVar9;
  if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff) {
    lVar5 = uVar7 - (this->super_LegacyDataSPKM).setExternalKeyPool._M_t._M_impl.
                    super__Rb_tree_header._M_node_count;
    parameters_2 = 0;
    if (0 < lVar5) {
      parameters_2 = lVar5;
    }
    lVar5 = uVar7 - (this->super_LegacyDataSPKM).setInternalKeyPool._M_t._M_impl.
                    super__Rb_tree_header._M_node_count;
  }
  else {
    lVar5 = (uVar7 - chain->nExternalChainCounter) + chain->m_next_external_index;
    parameters_2 = 0;
    if (0 < lVar5) {
      parameters_2 = lVar5;
    }
    lVar5 = (uVar7 - chain->nInternalChainCounter) + chain->m_next_internal_index;
  }
  parameters_1 = 0;
  if (0 < lVar5) {
    parameters_1 = lVar5;
  }
  iVar4 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0xc])(this);
  if ((char)iVar4 == '\0') {
LAB_00c06087:
    parameters_1 = 0;
  }
  else {
    pWVar3 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
    iVar4 = (*pWVar3->_vptr_WalletStorage[6])(pWVar3,0x2227c);
    if ((char)iVar4 == '\0') goto LAB_00c06087;
  }
  lVar5 = parameters_1 + parameters_2;
  if (lVar5 != 0) {
    pCVar6 = &chain->seed_id;
    internal = false;
    parameters_00 = lVar5;
    do {
      if (lVar5 <= parameters_1) {
        internal = true;
      }
      GenerateNewKey(&local_79,this,batch,chain,internal);
      auVar10[0] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[0] ==
                    (pCVar6->super_uint160).super_base_blob<160U>.m_data._M_elems[0]);
      auVar10[1] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[1] ==
                    (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[1]);
      auVar10[2] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[2] ==
                    (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[2]);
      auVar10[3] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[3] ==
                    (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[3]);
      auVar10[4] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[4] ==
                    (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[4]);
      auVar10[5] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[5] ==
                    (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[5]);
      auVar10[6] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[6] ==
                    (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[6]);
      auVar10[7] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[7] ==
                    (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[7]);
      auVar10[8] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[8] ==
                    (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[8]);
      auVar10[9] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[9] ==
                    (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[9]);
      auVar10[10] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                      super_base_blob<160U>.m_data._M_elems[10] ==
                     (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[10]);
      auVar10[0xb] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                       super_base_blob<160U>.m_data._M_elems[0xb] ==
                      (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[0xb]);
      auVar10[0xc] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                       super_base_blob<160U>.m_data._M_elems[0xc] ==
                      (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[0xc]);
      auVar10[0xd] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                       super_base_blob<160U>.m_data._M_elems[0xd] ==
                      (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[0xd]);
      auVar10[0xe] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                       super_base_blob<160U>.m_data._M_elems[0xe] ==
                      (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[0xe]);
      auVar10[0xf] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                       super_base_blob<160U>.m_data._M_elems[0xf] ==
                      (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[0xf]);
      uVar1 = *(undefined4 *)
               ((chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 0x10);
      uVar2 = *(undefined4 *)
               ((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.super_base_blob<160U>.
                m_data._M_elems + 0x10);
      auVar13[0] = -((char)uVar2 == (char)uVar1);
      auVar13[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)uVar1 >> 8));
      auVar13[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)uVar1 >> 0x10));
      auVar13[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)uVar1 >> 0x18));
      auVar13[4] = 0xff;
      auVar13[5] = 0xff;
      auVar13[6] = 0xff;
      auVar13[7] = 0xff;
      auVar13[8] = 0xff;
      auVar13[9] = 0xff;
      auVar13[10] = 0xff;
      auVar13[0xb] = 0xff;
      auVar13[0xc] = 0xff;
      auVar13[0xd] = 0xff;
      auVar13[0xe] = 0xff;
      auVar13[0xf] = 0xff;
      auVar13 = auVar13 & auVar10;
      if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff) {
        AddKeypoolPubkeyWithDB(this,&local_79,internal,batch);
      }
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    if (parameters_00 != 0) {
      auVar11[0] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[0] ==
                    (pCVar6->super_uint160).super_base_blob<160U>.m_data._M_elems[0]);
      auVar11[1] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[1] ==
                    (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[1]);
      auVar11[2] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[2] ==
                    (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[2]);
      auVar11[3] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[3] ==
                    (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[3]);
      auVar11[4] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[4] ==
                    (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[4]);
      auVar11[5] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[5] ==
                    (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[5]);
      auVar11[6] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[6] ==
                    (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[6]);
      auVar11[7] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[7] ==
                    (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[7]);
      auVar11[8] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[8] ==
                    (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[8]);
      auVar11[9] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                     super_base_blob<160U>.m_data._M_elems[9] ==
                    (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[9]);
      auVar11[10] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                      super_base_blob<160U>.m_data._M_elems[10] ==
                     (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[10]);
      auVar11[0xb] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                       super_base_blob<160U>.m_data._M_elems[0xb] ==
                      (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[0xb]);
      auVar11[0xc] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                       super_base_blob<160U>.m_data._M_elems[0xc] ==
                      (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[0xc]);
      auVar11[0xd] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                       super_base_blob<160U>.m_data._M_elems[0xd] ==
                      (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[0xd]);
      auVar11[0xe] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                       super_base_blob<160U>.m_data._M_elems[0xe] ==
                      (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[0xe]);
      auVar11[0xf] = -((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.
                       super_base_blob<160U>.m_data._M_elems[0xf] ==
                      (chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems[0xf]);
      uVar1 = *(undefined4 *)
               ((chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 0x10);
      uVar2 = *(undefined4 *)
               ((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.super_base_blob<160U>.
                m_data._M_elems + 0x10);
      auVar14[0] = -((char)uVar2 == (char)uVar1);
      auVar14[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)uVar1 >> 8));
      auVar14[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)uVar1 >> 0x10));
      auVar14[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)uVar1 >> 0x18));
      auVar14[4] = 0xff;
      auVar14[5] = 0xff;
      auVar14[6] = 0xff;
      auVar14[7] = 0xff;
      auVar14[8] = 0xff;
      auVar14[9] = 0xff;
      auVar14[10] = 0xff;
      auVar14[0xb] = 0xff;
      auVar14[0xc] = 0xff;
      auVar14[0xd] = 0xff;
      auVar14[0xe] = 0xff;
      auVar14[0xf] = 0xff;
      auVar14 = auVar14 & auVar11;
      if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff) {
        parameters_3 = (this->super_LegacyDataSPKM).setInternalKeyPool._M_t._M_impl.
                       super__Rb_tree_header._M_node_count;
        ScriptPubKeyMan::WalletLogPrintf<long,long,unsigned_long,unsigned_long>
                  ((ScriptPubKeyMan *)this,
                   "keypool added %d keys (%d internal), size=%u (%u internal)\n",parameters_00,
                   parameters_1,
                   (this->super_LegacyDataSPKM).setExternalKeyPool._M_t._M_impl.
                   super__Rb_tree_header._M_node_count + parameters_3 +
                   (this->super_LegacyDataSPKM).set_pre_split_keypool._M_t._M_impl.
                   super__Rb_tree_header._M_node_count,parameters_3);
      }
      else {
        s.m_size = 0x14;
        s.m_data = (uchar *)pCVar6;
        bVar15 = bVar8;
        HexStr_abi_cxx11_(&local_a0,s);
        parameters._M_dataplus._M_p._7_1_ = bVar15;
        parameters._M_dataplus._M_p._0_7_ = in_stack_ffffffffffffff28;
        parameters._M_string_length = parameters_1;
        parameters.field_2._M_allocated_capacity = (size_type)batch;
        parameters.field_2._8_8_ = parameters_00;
        ScriptPubKeyMan::WalletLogPrintf<std::__cxx11::string,long,long>
                  ((ScriptPubKeyMan *)this,
                   "inactive seed with id %s added %d external keys, %d internal keys\n",parameters,
                   (long)&local_a0,parameters_2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
LAB_00c061fa:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(bVar8 ^ 1);
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::TopUpChain(WalletBatch& batch, CHDChain& chain, unsigned int kpSize)
{
    LOCK(cs_KeyStore);

    if (m_storage.IsLocked()) return false;

    // Top up key pool
    unsigned int nTargetSize;
    if (kpSize > 0) {
        nTargetSize = kpSize;
    } else {
        nTargetSize = m_keypool_size;
    }
    int64_t target = std::max((int64_t) nTargetSize, int64_t{1});

    // count amount of available keys (internal, external)
    // make sure the keypool of external and internal keys fits the user selected target (-keypool)
    int64_t missingExternal;
    int64_t missingInternal;
    if (chain == m_hd_chain) {
        missingExternal = std::max(target - (int64_t)setExternalKeyPool.size(), int64_t{0});
        missingInternal = std::max(target - (int64_t)setInternalKeyPool.size(), int64_t{0});
    } else {
        missingExternal = std::max(target - (chain.nExternalChainCounter - chain.m_next_external_index), int64_t{0});
        missingInternal = std::max(target - (chain.nInternalChainCounter - chain.m_next_internal_index), int64_t{0});
    }

    if (!IsHDEnabled() || !m_storage.CanSupportFeature(FEATURE_HD_SPLIT)) {
        // don't create extra internal keys
        missingInternal = 0;
    }
    bool internal = false;
    for (int64_t i = missingInternal + missingExternal; i--;) {
        if (i < missingInternal) {
            internal = true;
        }

        CPubKey pubkey(GenerateNewKey(batch, chain, internal));
        if (chain == m_hd_chain) {
            AddKeypoolPubkeyWithDB(pubkey, internal, batch);
        }
    }
    if (missingInternal + missingExternal > 0) {
        if (chain == m_hd_chain) {
            WalletLogPrintf("keypool added %d keys (%d internal), size=%u (%u internal)\n", missingInternal + missingExternal, missingInternal, setInternalKeyPool.size() + setExternalKeyPool.size() + set_pre_split_keypool.size(), setInternalKeyPool.size());
        } else {
            WalletLogPrintf("inactive seed with id %s added %d external keys, %d internal keys\n", HexStr(chain.seed_id), missingExternal, missingInternal);
        }
    }
    return true;
}